

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prepared_statement.hpp
# Opt level: O0

unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> __thiscall
duckdb::PreparedStatement::ExecuteRecursive<char_const*>
          (PreparedStatement *this,vector<duckdb::Value,_true> *values,char *value)

{
  PreparedStatement *in_RSI;
  _Head_base<0UL,_duckdb::QueryResult_*,_false> in_RDI;
  _Head_base<0UL,_duckdb::QueryResult_*,_false> this_00;
  Value local_60 [96];
  
  this_00._M_head_impl = in_RDI._M_head_impl;
  duckdb::Value::CreateValue<char_const*>((char *)local_60);
  std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::push_back
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)this_00._M_head_impl,
             (value_type *)in_RDI._M_head_impl);
  duckdb::Value::~Value(local_60);
  ExecuteRecursive(in_RSI,(vector<duckdb::Value,_true> *)this_00._M_head_impl);
  return (unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>)
         (_Tuple_impl<0UL,_duckdb::QueryResult_*,_std::default_delete<duckdb::QueryResult>_>)
         this_00._M_head_impl;
}

Assistant:

unique_ptr<QueryResult> ExecuteRecursive(vector<Value> &values, T value, ARGS... args) {
		values.push_back(Value::CreateValue<T>(value));
		return ExecuteRecursive(values, args...);
	}